

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O2

int whiptailPresent(void)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  
  iVar1 = whiptailPresentOnly();
  if (iVar1 != 0) {
    iVar2 = isTerminalRunning();
    if (iVar2 != 0) {
      return iVar1;
    }
    pcVar3 = terminalName();
    if (pcVar3 != (char *)0x0) {
      return iVar1;
    }
  }
  return 0;
}

Assistant:

static int whiptailPresent( )
{
        int lWhiptailPresent ;
    lWhiptailPresent = whiptailPresentOnly( ) ;
        if ( lWhiptailPresent && ( isTerminalRunning() || terminalName() ) )
        {
                return lWhiptailPresent ;
        }
        else
        {
                return 0 ;
        }
}